

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O1

void __thiscall
hbm::streaming::StreamClient::subscribe(StreamClient *this,signalReferences_t *signalReferences)

{
  Controller controller;
  allocator local_b1;
  string local_b0;
  Controller local_90;
  
  std::__cxx11::string::string((string *)&local_b0,(this->m_address)._M_dataplus._M_p,&local_b1);
  Controller::Controller
            (&local_90,&this->m_streamId,&local_b0,&this->m_controlPort,&this->m_httpPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  Controller::subscribe(&local_90,signalReferences);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_httpPost.m_httpPath._M_dataplus._M_p != &local_90.m_httpPost.m_httpPath.field_2)
  {
    operator_delete(local_90.m_httpPost.m_httpPath._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_httpPost.m_port._M_dataplus._M_p != &local_90.m_httpPost.m_port.field_2) {
    operator_delete(local_90.m_httpPost.m_port._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_httpPost.m_address._M_dataplus._M_p != &local_90.m_httpPost.m_address.field_2) {
    operator_delete(local_90.m_httpPost.m_address._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_streamId._M_dataplus._M_p != &local_90.m_streamId.field_2) {
    operator_delete(local_90.m_streamId._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StreamClient::subscribe(const signalReferences_t& signalReferences)
		{
			Controller controller(m_streamId, m_address.c_str(), m_controlPort, m_httpPath);
			controller.subscribe(signalReferences);
		}